

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::ComputeLinkImplementationLibraries
          (cmGeneratorTarget *this,string *config,cmOptionalLinkImplementation *impl,
          cmGeneratorTarget *head)

{
  pointer ppVar1;
  __type _Var2;
  bool bVar3;
  PolicyStatus PVar4;
  cmTargetLinkLibraryType cVar5;
  string *psVar6;
  string *psVar7;
  ostream *poVar8;
  cmake *pcVar9;
  char *pcVar10;
  _Rb_tree_node_base *p_Var11;
  LinkLibraryVectorType *pLVar12;
  PolicyID id;
  MessageType t;
  _Rb_tree_node_base *p_Var13;
  pointer item;
  pointer item_00;
  cmStringRange cVar14;
  cmBacktraceRange cVar15;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  __shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *local_320;
  string local_318;
  string *local_2f0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2e8;
  string *local_2e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  llibs;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2b0;
  undefined1 local_298 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugConfigs;
  __shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> local_268;
  cmGeneratorExpression ge;
  string local_248;
  cmGeneratorExpressionDAGChecker dagChecker;
  ostringstream e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [22];
  
  local_2f0 = config;
  cVar14 = cmTarget::GetLinkImplementationEntries_abi_cxx11_(this->Target);
  cVar15 = cmTarget::GetLinkImplementationBacktraces(this->Target);
  local_320 = (__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)
              cVar15.Begin._M_current;
  do {
    local_2b0 = cVar14.End._M_current;
    if (cVar14.Begin._M_current._M_current == local_2b0._M_current) {
      pcVar9 = cmMakefile::GetCMakeInstance(this->Makefile);
      cmake::GetDebugConfigs_abi_cxx11_(&debugConfigs,pcVar9);
      cVar5 = CMP0003_ComputeLinkType(local_2f0,&debugConfigs);
      pLVar12 = cmTarget::GetOriginalLinkLibraries_abi_cxx11_(this->Target);
      ppVar1 = (pLVar12->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (item = (pLVar12->
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; item != ppVar1; item = item + 1) {
        if ((item->second != GENERAL_LibraryType) && (item->second != cVar5)) {
          CheckCMP0004((string *)&dagChecker,this,&item->first);
          psVar6 = GetName_abi_cxx11_(this);
          _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&dagChecker,psVar6);
          if ((!_Var2) && (dagChecker.Target != (cmGeneratorTarget *)0x0)) {
            local_318._M_dataplus._M_p = (pointer)0x0;
            local_318._M_string_length = 0;
            ResolveLinkItem((cmLinkItem *)&e,this,(string *)&dagChecker,
                            (cmListFileBacktrace *)&local_318);
            std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::emplace_back<cmLinkItem>
                      (&(impl->super_cmLinkImplementation).super_cmLinkImplementationLibraries.
                        WrongConfigLibraries,(cmLinkItem *)&e);
            cmLinkItem::~cmLinkItem((cmLinkItem *)&e);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_318._M_string_length);
          }
          std::__cxx11::string::~string((string *)&dagChecker);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&debugConfigs);
      return;
    }
    llibs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    llibs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    llibs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_248,"LINK_LIBRARIES",(allocator<char> *)&e);
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              (&dagChecker,this,&local_248,(GeneratorExpressionContent *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0);
    std::__cxx11::string::~string((string *)&local_248);
    std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_268,local_320);
    cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)&local_268);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_268._M_refcount);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)&cge,(string *)&ge);
    _e = (pointer)local_198;
    local_198[0]._M_local_buf[0] = '\0';
    psVar6 = cmCompiledGeneratorExpression::Evaluate
                       ((cmCompiledGeneratorExpression *)
                        cge._M_t.
                        super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                        .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl,
                        this->LocalGenerator,local_2f0,false,head,&dagChecker,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    cmSystemTools::ExpandListArgument(psVar6,&llibs,false);
    if (*(char *)((long)cge._M_t.
                        super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                        .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl
                 + 0x131) == '\x01') {
      impl->HadHeadSensitiveCondition = true;
    }
    local_2e0 = llibs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    item_00 = llibs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    while( true ) {
      local_2b0 = cVar14.End._M_current;
      local_2e8 = cVar14.Begin._M_current;
      if (item_00 == local_2e0) break;
      CheckCMP0004((string *)&debugConfigs,this,item_00);
      psVar7 = GetName_abi_cxx11_(this);
      _Var2 = std::operator==((string *)&debugConfigs,psVar7);
      if ((_Var2) ||
         (debugConfigs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0)) {
        psVar7 = GetName_abi_cxx11_(this);
        _Var2 = std::operator==((string *)&debugConfigs,psVar7);
        if (_Var2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          PVar4 = GetPolicyStatusCMP0038(this);
          if (PVar4 != OLD) {
            t = FATAL_ERROR;
            if (PVar4 == WARN) {
              cmPolicies::GetPolicyWarning_abi_cxx11_(&local_318,(cmPolicies *)0x26,id);
              poVar8 = std::operator<<((ostream *)&e,(string *)&local_318);
              std::operator<<(poVar8,"\n");
              std::__cxx11::string::~string((string *)&local_318);
              t = AUTHOR_WARNING;
            }
            poVar8 = std::operator<<((ostream *)&e,"Target \"");
            psVar7 = GetName_abi_cxx11_(this);
            poVar8 = std::operator<<(poVar8,(string *)psVar7);
            std::operator<<(poVar8,"\" links to itself.");
            pcVar9 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
            std::__cxx11::stringbuf::str();
            GetBacktrace((cmGeneratorTarget *)local_298);
            cmake::IssueMessage(pcVar9,t,&local_318,(cmListFileBacktrace *)local_298);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_298 + 8));
            std::__cxx11::string::~string((string *)&local_318);
            if (PVar4 != WARN) {
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
              std::__cxx11::string::~string((string *)&debugConfigs);
              goto LAB_0023bf66;
            }
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        }
      }
      else {
        ResolveLinkItem((cmLinkItem *)&e,this,(string *)&debugConfigs,
                        (cmListFileBacktrace *)local_320);
        bVar3 = std::operator!=(psVar6,local_2e8._M_current);
        local_318._M_dataplus._M_p._0_1_ = bVar3;
        std::vector<cmLinkImplItem,std::allocator<cmLinkImplItem>>::emplace_back<cmLinkItem,bool>
                  ((vector<cmLinkImplItem,std::allocator<cmLinkImplItem>> *)impl,(cmLinkItem *)&e,
                   (bool *)&local_318);
        cmLinkItem::~cmLinkItem((cmLinkItem *)&e);
      }
      std::__cxx11::string::~string((string *)&debugConfigs);
      cVar14.End._M_current = local_2b0._M_current;
      cVar14.Begin._M_current = local_2e8._M_current;
      item_00 = item_00 + 1;
    }
    p_Var11 = *(_Rb_tree_node_base **)
               ((long)cge._M_t.
                      super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                      .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl +
               200);
    p_Var13 = (_Rb_tree_node_base *)
              ((long)cge._M_t.
                     super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                     .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl +
              0xb8);
    while( true ) {
      local_2b0 = cVar14.End._M_current;
      local_2e8 = cVar14.Begin._M_current;
      if (p_Var11 == p_Var13) break;
      pcVar10 = GetProperty(this,(string *)(p_Var11 + 1));
      if (pcVar10 == (char *)0x0) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&this->LinkImplicitNullProperties,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (p_Var11 + 1));
      }
      p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
      cVar14.End._M_current = local_2b0._M_current;
      cVar14.Begin._M_current = local_2e8._M_current;
    }
    cmCompiledGeneratorExpression::GetMaxLanguageStandard
              ((cmCompiledGeneratorExpression *)
               cge._M_t.
               super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
               .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl,this,
               &this->MaxLanguageStandards);
LAB_0023bf66:
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr(&cge);
    cmGeneratorExpression::~cmGeneratorExpression(&ge);
    cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker(&dagChecker);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&llibs);
    if (item_00 != local_2e0) {
      return;
    }
    cVar14.End._M_current = local_2b0._M_current;
    cVar14.Begin._M_current = local_2e8._M_current + 1;
    local_320 = local_320 + 1;
  } while( true );
}

Assistant:

void cmGeneratorTarget::ComputeLinkImplementationLibraries(
  const std::string& config, cmOptionalLinkImplementation& impl,
  cmGeneratorTarget const* head) const
{
  cmStringRange entryRange = this->Target->GetLinkImplementationEntries();
  cmBacktraceRange btRange = this->Target->GetLinkImplementationBacktraces();
  cmBacktraceRange::const_iterator btIt = btRange.begin();
  // Collect libraries directly linked in this configuration.
  for (cmStringRange::const_iterator le = entryRange.begin(),
                                     end = entryRange.end();
       le != end; ++le, ++btIt) {
    std::vector<std::string> llibs;
    cmGeneratorExpressionDAGChecker dagChecker(this, "LINK_LIBRARIES", nullptr,
                                               nullptr);
    cmGeneratorExpression ge(*btIt);
    std::unique_ptr<cmCompiledGeneratorExpression> const cge = ge.Parse(*le);
    std::string const& evaluated =
      cge->Evaluate(this->LocalGenerator, config, false, head, &dagChecker);
    cmSystemTools::ExpandListArgument(evaluated, llibs);
    if (cge->GetHadHeadSensitiveCondition()) {
      impl.HadHeadSensitiveCondition = true;
    }

    for (std::string const& lib : llibs) {
      // Skip entries that resolve to the target itself or are empty.
      std::string name = this->CheckCMP0004(lib);
      if (name == this->GetName() || name.empty()) {
        if (name == this->GetName()) {
          bool noMessage = false;
          MessageType messageType = MessageType::FATAL_ERROR;
          std::ostringstream e;
          switch (this->GetPolicyStatusCMP0038()) {
            case cmPolicies::WARN: {
              e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0038) << "\n";
              messageType = MessageType::AUTHOR_WARNING;
            } break;
            case cmPolicies::OLD:
              noMessage = true;
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::NEW:
              // Issue the fatal message.
              break;
          }

          if (!noMessage) {
            e << "Target \"" << this->GetName() << "\" links to itself.";
            this->LocalGenerator->GetCMakeInstance()->IssueMessage(
              messageType, e.str(), this->GetBacktrace());
            if (messageType == MessageType::FATAL_ERROR) {
              return;
            }
          }
        }
        continue;
      }

      // The entry is meant for this configuration.
      impl.Libraries.emplace_back(this->ResolveLinkItem(name, *btIt),
                                  evaluated != *le);
    }

    std::set<std::string> const& seenProps = cge->GetSeenTargetProperties();
    for (std::string const& sp : seenProps) {
      if (!this->GetProperty(sp)) {
        this->LinkImplicitNullProperties.insert(sp);
      }
    }
    cge->GetMaxLanguageStandard(this, this->MaxLanguageStandards);
  }

  // Get the list of configurations considered to be DEBUG.
  std::vector<std::string> debugConfigs =
    this->Makefile->GetCMakeInstance()->GetDebugConfigs();

  cmTargetLinkLibraryType linkType =
    CMP0003_ComputeLinkType(config, debugConfigs);
  cmTarget::LinkLibraryVectorType const& oldllibs =
    this->Target->GetOriginalLinkLibraries();
  for (cmTarget::LibraryID const& oldllib : oldllibs) {
    if (oldllib.second != GENERAL_LibraryType && oldllib.second != linkType) {
      std::string name = this->CheckCMP0004(oldllib.first);
      if (name == this->GetName() || name.empty()) {
        continue;
      }
      // Support OLD behavior for CMP0003.
      impl.WrongConfigLibraries.push_back(
        this->ResolveLinkItem(name, cmListFileBacktrace()));
    }
  }
}